

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

double __thiscall VCCluster::energyWithItem(VCCluster *this,VCFace *f)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector3d zi;
  double local_28;
  double dStack_20;
  double local_18;
  
  dVar8 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  dVar6 = f->area;
  dVar7 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0];
  dVar4 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[0];
  dVar5 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[1];
  dVar1 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2];
  dVar2 = (this->weightedSum).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[2];
  dVar3 = this->area;
  (*this->_vptr_VCCluster[7])(&local_28,this);
  dVar8 = (dVar8 * dVar6 + dVar5) * dStack_20 + (dVar1 * dVar6 + dVar2) * local_18 +
          (dVar6 * dVar7 + dVar4) * local_28;
  return (dStack_20 * dStack_20 + local_18 * local_18 + local_28 * local_28) * (dVar6 + dVar3) -
         (dVar8 + dVar8);
}

Assistant:

double VCCluster::energyWithItem(VCFace* f) {
	Vector3d ws = weightedSum + f->center * f->area;
	double a = area + f->area;
	Vector3d zi = center();
	return a * zi.dot(zi) - 2 * zi.dot(ws);
}